

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O3

Num * __thiscall Num::createNumber(Num *__return_storage_ptr__,Num *this,Short k)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  ulong uVar3;
  size_t __i;
  long lVar4;
  int iVar5;
  Num *number;
  uniform_int_distribution<int> d2;
  string a;
  uniform_int_distribution<int> d2_1;
  mt19937 gen;
  random_device rd;
  param_type local_2770;
  string local_2768;
  param_type local_2748;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar2 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar2;
  lVar4 = 1;
  uVar3 = local_2740._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
    local_2740._M_x[lVar4] = uVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_2740._M_p = 0x270;
  paVar1 = &local_2768.field_2;
  local_2768._M_string_length = 0;
  local_2768.field_2._M_local_buf[0] = '\0';
  local_2768._M_dataplus._M_p = (pointer)paVar1;
  if (k == 1) {
    local_2770._M_a = 0;
    local_2770._M_b = 9;
    std::uniform_int_distribution<int>::operator()
              ((uniform_int_distribution<int> *)&local_2770,&local_2740,&local_2770);
    std::__cxx11::string::push_back((char)&local_2768);
  }
  else {
    local_2770._M_a = 1;
    local_2770._M_b = 9;
    local_2748._M_a = 0;
    local_2748._M_b = 9;
    if (k != 0) {
      iVar5 = k - 1;
      do {
        std::uniform_int_distribution<int>::operator()
                  ((uniform_int_distribution<int> *)&local_2770,&local_2740,&local_2770);
        std::__cxx11::string::push_back((char)&local_2768);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    std::uniform_int_distribution<int>::operator()
              ((uniform_int_distribution<int> *)&local_2748,&local_2740,&local_2748);
    std::__cxx11::string::push_back((char)&local_2768);
  }
  Num(__return_storage_ptr__,&local_2768,k);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2768._M_dataplus._M_p != paVar1) {
    operator_delete(local_2768._M_dataplus._M_p,
                    CONCAT71(local_2768.field_2._M_allocated_capacity._1_7_,
                             local_2768.field_2._M_local_buf[0]) + 1);
  }
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

Num Num::createNumber(Short k)
{

    std::random_device rd;
    std::mt19937 gen(rd());
    std::string a;

    if (k == 1)
    {
        std::uniform_int_distribution<> d2(0, 9);
        a.push_back(static_cast<char>(48 + d2(gen)));
    }
    else
    {
        std::uniform_int_distribution<> d1(1, 9);
        std::uniform_int_distribution<> d2(0, 9);
        for (int i = 0; i < k - 1; ++i)
        {
            a.push_back(static_cast<char>(48 + d1(gen)));
        }
        a.push_back(static_cast<char>(48 + d2(gen)));
    }
    Num number(a, k);

    return number;
}